

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O1

string * bitstring<(unsigned_char)3,(unsigned_char)3>
                   (string *__return_storage_ptr__,
                   flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *ff)

{
  long lVar1;
  stringstream buffer;
  stringstream asStack_1a8 [16];
  long local_198 [14];
  ios_base local_128 [80];
  uint auStack_d8 [2];
  long alStack_d0 [22];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (get_manipulator_id()::id == '\0') {
    bitstring<(unsigned_char)3,(unsigned_char)3>();
  }
  if (get_manipulator_id()::id < *(uint *)((long)auStack_d8 + lVar1)) {
    lVar1 = (long)(int)get_manipulator_id()::id * 0x10 + *(long *)((long)alStack_d0 + lVar1);
  }
  else {
    lVar1 = std::ios_base::_M_grow_words
                      ((int)lVar1 + (int)(ostream *)local_198,SUB41(get_manipulator_id()::id,0));
  }
  *(undefined8 *)(lVar1 + 8) = 1;
  operator<<((ostream *)local_198,ff);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string bitstring(const flexfloat<e, f> &ff) noexcept
{
    std::stringstream buffer;
    buffer << flexfloat_as_bits << ff;
    return buffer.str();
}